

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unarc.c
# Opt level: O0

char prompt_user(char *filename)

{
  ssize_t sVar1;
  ushort **ppuVar2;
  char local_68 [8];
  char buffer [80];
  int c;
  char *filename_local;
  
  while( true ) {
    fprintf(_stderr,"\n\"%s\" exists, overwrite ? (Yes/No/All/Rename): ",filename);
    fflush(_stderr);
    sVar1 = read(0,local_68,0x4f);
    if (sVar1 < 1) break;
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)local_68[0]] & 0x100) == 0) {
      buffer._76_4_ = SEXT14(local_68[0]);
    }
    else {
      buffer._76_4_ = tolower((int)local_68[0]);
    }
    if ((((buffer._76_4_ == 0x79) || (buffer._76_4_ == 0x6e)) || (buffer._76_4_ == 0x61)) ||
       (buffer._76_4_ == 0x72)) goto LAB_00102977;
  }
  buffer[0x4c] = 'n';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x4f] = '\0';
LAB_00102977:
  return (char)buffer._76_4_;
}

Assistant:

char
prompt_user(char *filename)
{
	int c;
	char buffer[80];

	while (1)
	{
		fprintf(stderr, "\n\"%s\" exists, overwrite ? (Yes/No/All/Rename): ",
			   filename);
		fflush(stderr);
		if (read(0, buffer, sizeof(buffer) - 1)<1) {
			c = 'n';
			break;
		}
		if (isupper(*buffer))
			c = tolower(*buffer);
		else
			c = *buffer;
		if (c == 'y' || c == 'n' || c == 'a' || c == 'r')
			break;
	}
	return (c);
}